

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O0

void __thiscall
Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage
          (D3MFOpcPackage *this,IOSystem *pIOHandler,string *rFile)

{
  bool bVar1;
  __type _Var2;
  uint uVar3;
  int iVar4;
  ZipArchiveIOSystem *this_00;
  pointer pZVar5;
  DeadlyImportError *pDVar6;
  reference __lhs;
  undefined8 uVar7;
  undefined4 extraout_var;
  long lVar8;
  char *pcVar9;
  undefined4 extraout_var_00;
  Logger *pLVar10;
  basic_formatter *pbVar11;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  string local_2f8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_160;
  undefined1 local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118 [32];
  string local_f8 [32];
  undefined1 local_d8 [8];
  string rootFile;
  IOStream *fileStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_20;
  string *rFile_local;
  IOSystem *pIOHandler_local;
  D3MFOpcPackage *this_local;
  
  this->mRootStream = (IOStream *)0x0;
  local_20 = rFile;
  rFile_local = (string *)pIOHandler;
  pIOHandler_local = (IOSystem *)this;
  std::unique_ptr<Assimp::ZipArchiveIOSystem,std::default_delete<Assimp::ZipArchiveIOSystem>>::
  unique_ptr<std::default_delete<Assimp::ZipArchiveIOSystem>,void>
            ((unique_ptr<Assimp::ZipArchiveIOSystem,std::default_delete<Assimp::ZipArchiveIOSystem>>
              *)&this->mZipArchive);
  this_00 = (ZipArchiveIOSystem *)
            Intern::AllocateFromAssimpHeap::operator_new
                      ((AllocateFromAssimpHeap *)0x28,(size_t)pIOHandler);
  ZipArchiveIOSystem::ZipArchiveIOSystem(this_00,(IOSystem *)rFile_local,local_20,"r");
  std::unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>::
  reset(&this->mZipArchive,this_00);
  pZVar5 = std::
           unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           ::operator->(&this->mZipArchive);
  bVar1 = ZipArchiveIOSystem::isOpen(pZVar5);
  if (!bVar1) {
    fileList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_70,"Failed to open file ",local_20);
    std::operator+(&local_50,&local_70,".");
    DeadlyImportError::DeadlyImportError(pDVar6,&local_50);
    fileList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  pZVar5 = std::
           unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           ::operator->(&this->mZipArchive);
  ZipArchiveIOSystem::getFileList
            (pZVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
  file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&file);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
      return;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
    _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)XmlTag::ROOT_RELATIONSHIPS_ARCHIVE_abi_cxx11_);
    if (_Var2) {
      pZVar5 = std::
               unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ::operator->(&this->mZipArchive);
      uVar7 = std::__cxx11::string::c_str();
      uVar3 = (*(pZVar5->super_IOSystem)._vptr_IOSystem[2])(pZVar5,uVar7);
      if ((uVar3 & 1) == 0) {
        __assert_fail("mZipArchive->Exists(file.c_str())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/3MF/D3MFOpcPackage.cpp"
                      ,0x87,
                      "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                     );
      }
      pZVar5 = std::
               unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ::operator->(&this->mZipArchive);
      uVar7 = std::__cxx11::string::c_str();
      iVar4 = (*(pZVar5->super_IOSystem)._vptr_IOSystem[4])(pZVar5,uVar7,"rb");
      rootFile.field_2._8_8_ = CONCAT44(extraout_var,iVar4);
      if ((IOStream *)rootFile.field_2._8_8_ == (IOStream *)0x0) {
        __assert_fail("fileStream != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/3MF/D3MFOpcPackage.cpp"
                      ,0x8b,
                      "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                     );
      }
      ReadPackageRootRelationship_abi_cxx11_
                ((string *)local_d8,this,(IOStream *)rootFile.field_2._8_8_);
      lVar8 = std::__cxx11::string::size();
      if ((lVar8 != 0) &&
         (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_d8), *pcVar9 == '/')) {
        std::__cxx11::string::substr((ulong)local_f8,(ulong)local_d8);
        std::__cxx11::string::operator=((string *)local_d8,local_f8);
        std::__cxx11::string::~string(local_f8);
        pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_d8);
        if (*pcVar9 == '/') {
          std::__cxx11::string::substr((ulong)local_118,(ulong)local_d8);
          std::__cxx11::string::operator=((string *)local_d8,local_118);
          std::__cxx11::string::~string(local_118);
        }
      }
      pLVar10 = DefaultLogger::get();
      Logger::debug(pLVar10,(string *)local_d8);
      pZVar5 = std::
               unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ::operator->(&this->mZipArchive);
      (*(pZVar5->super_IOSystem)._vptr_IOSystem[5])(pZVar5,rootFile.field_2._8_8_);
      pZVar5 = std::
               unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ::operator->(&this->mZipArchive);
      uVar7 = std::__cxx11::string::c_str();
      iVar4 = (*(pZVar5->super_IOSystem)._vptr_IOSystem[4])(pZVar5,uVar7,"rb");
      this->mRootStream = (IOStream *)CONCAT44(extraout_var_00,iVar4);
      if (this->mRootStream == (IOStream *)0x0) {
        __assert_fail("mRootStream != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/3MF/D3MFOpcPackage.cpp"
                      ,0x9b,
                      "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                     );
      }
      if (this->mRootStream == (IOStream *)0x0) {
        local_139 = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_138,"Cannot open root-file in archive : ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        DeadlyImportError::DeadlyImportError(pDVar6,&local_138);
        local_139 = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      std::__cxx11::string::~string((string *)local_d8);
    }
    else {
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)XmlTag::CONTENT_TYPES_ARCHIVE_abi_cxx11_);
      if (_Var2) {
        pLVar10 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[56]>
                  (&local_2d8,
                   (char (*) [56])"Ignored file of unsupported type CONTENT_TYPES_ARCHIVES");
        pbVar11 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_2d8,__lhs);
        Formatter::basic_formatter::operator_cast_to_string(&local_160,pbVar11);
        Logger::warn(pLVar10,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_2d8);
      }
      else {
        pLVar10 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[31]>(&local_470,(char (*) [31])"Ignored file of unknown type: ");
        pbVar11 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_470,__lhs);
        Formatter::basic_formatter::operator_cast_to_string(&local_2f8,pbVar11);
        Logger::warn(pLVar10,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_470);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

D3MFOpcPackage::D3MFOpcPackage(IOSystem* pIOHandler, const std::string& rFile)
: mRootStream(nullptr)
, mZipArchive() {    
    mZipArchive.reset( new ZipArchiveIOSystem( pIOHandler, rFile ) );
    if(!mZipArchive->isOpen()) {
        throw DeadlyImportError("Failed to open file " + rFile+ ".");
    }

    std::vector<std::string> fileList;
    mZipArchive->getFileList(fileList);

    for (auto& file: fileList) {
        if(file == D3MF::XmlTag::ROOT_RELATIONSHIPS_ARCHIVE) {
            //PkgRelationshipReader pkgRelReader(file, archive);
            ai_assert(mZipArchive->Exists(file.c_str()));

            IOStream *fileStream = mZipArchive->Open(file.c_str());

            ai_assert(fileStream != nullptr);

            std::string rootFile = ReadPackageRootRelationship(fileStream);
            if ( rootFile.size() > 0 && rootFile[ 0 ] == '/' ) {
                rootFile = rootFile.substr( 1 );
                if ( rootFile[ 0 ] == '/' ) {
                    // deal with zip-bug
                    rootFile = rootFile.substr( 1 );
                }
            }

            ASSIMP_LOG_DEBUG(rootFile);

            mZipArchive->Close(fileStream);

            mRootStream = mZipArchive->Open(rootFile.c_str());
            ai_assert( mRootStream != nullptr );
            if ( nullptr == mRootStream ) {
                throw DeadlyExportError( "Cannot open root-file in archive : " + rootFile );
            }

        } else if( file == D3MF::XmlTag::CONTENT_TYPES_ARCHIVE) {
            ASSIMP_LOG_WARN_F("Ignored file of unsupported type CONTENT_TYPES_ARCHIVES",file);
        } else {
            ASSIMP_LOG_WARN_F("Ignored file of unknown type: ",file);
        }

    }
}